

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_lexer.cpp
# Opt level: O3

void __thiscall Lexer::initializeTokenMaps(Lexer *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  CompilationContext *pCVar3;
  long lVar4;
  char **ppcVar5;
  allocator local_89;
  Lexer *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_60;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::_Select1st<std::pair<std::__cxx11::string_const,TokenType>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>>
  *local_38;
  
  if ((this->tokenIdentStringToType)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    local_38 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::_Select1st<std::pair<std::__cxx11::string_const,TokenType>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>>
                *)&this->tokenIdentStringToType;
    paVar1 = &local_60.first.field_2;
    ppcVar5 = token_strings;
    lVar4 = 0;
    local_88 = this;
    do {
      cVar2 = **ppcVar5;
      if (cVar2 == '_' || (byte)(cVar2 + 0x9fU) < 0x1a) {
        std::__cxx11::string::string((string *)&local_80,*ppcVar5,&local_89);
        if (local_80 == &local_70) {
          local_60.first.field_2._8_8_ = local_70._8_8_;
          local_60.first._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_60.first._M_dataplus._M_p = (pointer)local_80;
        }
        local_60.first.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_;
        local_60.first.field_2._M_local_buf[0] = local_70._M_local_buf[0];
        local_60.first._M_string_length = local_78;
        local_78 = 0;
        local_70._M_local_buf[0] = '\0';
        local_60.second = (TokenType)lVar4;
        local_80 = &local_70;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::_Select1st<std::pair<std::__cxx11::string_const,TokenType>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,TokenType>>(local_38,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_60.first._M_dataplus._M_p);
        }
        if (local_80 != &local_70) {
          operator_delete(local_80);
        }
        pCVar3 = local_88->ctx;
        std::__cxx11::string::string((string *)&local_60,*ppcVar5,(allocator *)&local_80);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&pCVar3->stringList,&local_60.first);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_60.first._M_dataplus._M_p);
        }
      }
      lVar4 = lVar4 + 1;
      ppcVar5 = ppcVar5 + 1;
    } while (lVar4 != 99);
  }
  return;
}

Assistant:

void Lexer::initializeTokenMaps()
{
  if (!tokenIdentStringToType.empty())
    return;

  for (int i = 0; i < int(TOKEN_TYPE_COUNT); i++)
    if ((token_strings[i][0] >= 'a' && token_strings[i][0] <= 'z') || token_strings[i][0] == '_')
    {
      tokenIdentStringToType.insert(std::make_pair<std::string, TokenType>(token_strings[i], TokenType(i)));
      ctx.stringList.insert(token_strings[i]);
    }
}